

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wstring.hpp
# Opt level: O2

wstring * __thiscall
msgpack::v1::adaptor::
as<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_void>::
operator()(wstring *__return_storage_ptr__,
          as<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_void>
          *this,object *o)

{
  ulong uVar1;
  undefined8 *puVar2;
  object *this_00;
  object *poVar3;
  
  if ((o->super_object).type == ARRAY) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = L'\0';
    std::__cxx11::wstring::reserve((ulong)__return_storage_ptr__);
    uVar1 = (ulong)(o->super_object).via.array.size;
    if (uVar1 != 0) {
      this_00 = &((o->super_object).via.array.ptr)->super_object;
      poVar3 = this_00 + uVar1;
      do {
        object::as<wchar_t>(this_00);
        std::__cxx11::wstring::push_back((wchar_t)__return_storage_ptr__);
        this_00 = this_00 + 1;
      } while (this_00 < poVar3);
    }
    return __return_storage_ptr__;
  }
  puVar2 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar2 = &PTR__bad_cast_0017da08;
  __cxa_throw(puVar2,&type_error::typeinfo,std::bad_cast::~bad_cast);
}

Assistant:

std::wstring operator()(const msgpack::object& o) const {
        if (o.type != msgpack::type::ARRAY) { throw msgpack::type_error(); }
        std::wstring v;
        v.reserve(o.via.array.size);
        if (o.via.array.size > 0) {
            msgpack::object* p = o.via.array.ptr;
            msgpack::object* const pend = o.via.array.ptr + o.via.array.size;
            do {
                v.push_back(p->as<wchar_t>());
                ++p;
            } while (p < pend);
        }
        return v;
    }